

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c
# Opt level: O2

void logic_or(Vm *vm)

{
  _Bool _Var1;
  
  logic_and(vm);
  while( true ) {
    _Var1 = match(vm,TOKEN_OR);
    if (!_Var1) break;
    logic_and(vm);
    emit_no_arg(vm,OP_OR);
  }
  return;
}

Assistant:

static void logic_or(Vm *vm) {
    logic_and(vm);

    while (match(vm, TOKEN_OR)) {
        logic_and(vm);
        emit_no_arg(vm, OP_OR);
    }
}